

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>_>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>_>_>
         *this)

{
  double *pdVar1;
  bool *pbVar2;
  _Base_ptr p_Var3;
  ostringstream *poVar4;
  _Rb_tree_node_base *p_Var5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  Precision PVar7;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  size_t sVar8;
  Statement *pSVar9;
  ShaderExecutor *pSVar10;
  Variable<tcu::Matrix<float,_2,_4>_> *pVVar11;
  pointer pcVar12;
  double dVar13;
  pointer pMVar14;
  int iVar15;
  undefined8 uVar16;
  Interval *pIVar17;
  IVal *pIVar18;
  undefined8 *puVar19;
  uint uVar20;
  Interval *pIVar21;
  undefined1 *puVar22;
  Matrix<float,_2,_4> *val;
  long lVar23;
  long lVar24;
  char *pcVar25;
  _Base_ptr p_Var26;
  FloatFormat *pFVar27;
  string *msg;
  long lVar28;
  Interval *__return_storage_ptr___00;
  bool bVar29;
  bool bVar30;
  IVal in2;
  IVal in3;
  FloatFormat highpFmt;
  Environment env;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>_>_>
  outputs;
  IVal in1;
  IVal in0;
  void *outputArr [2];
  Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  void *inputArr [4];
  FuncSet funcs;
  ResultCollector status;
  ostringstream oss;
  deUint32 in_stack_fffffffffffff978;
  string local_680;
  TestLog *local_660;
  size_t local_658;
  IVal *local_650;
  string local_648;
  TestStatus *local_628;
  FloatFormat *local_620;
  FloatFormat local_618;
  long local_5f0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_5e8;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>_>_>
  local_5b8;
  undefined1 local_588 [16];
  undefined1 local_578 [176];
  undefined1 local_4c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b8;
  double local_4a8;
  Precision local_4a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_498;
  undefined4 local_490;
  ios_base local_458 [8];
  ios_base local_450 [264];
  pointer local_348;
  pointer local_340;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_338;
  pointer local_2d8;
  pointer local_2d0;
  pointer local_2c8;
  pointer local_2c0;
  undefined1 local_2b8 [12];
  YesNoMaybe YStack_2ac;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  _Rb_tree_node_base *local_298;
  double local_290;
  ResultCollector local_1f8;
  undefined1 local_1a8 [376];
  
  this_00 = this->m_samplings;
  pFVar27 = &(this->m_caseCtx).floatFormat;
  PVar7 = (this->m_caseCtx).precision;
  sVar8 = (this->m_caseCtx).numRandoms;
  local_628 = __return_storage_ptr__;
  iVar15 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  local_620 = pFVar27;
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,2,4>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_338,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)pFVar27,(FloatFormat *)(ulong)PVar7,(Precision)sVar8,(ulong)(iVar15 + 0xdeadbeef),
             in_stack_fffffffffffff978);
  pMVar14 = local_338.in0.
            super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_658 = (long)local_338.in0.
                    super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_338.in0.
                    super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>_>_>::
  Outputs(&local_5b8,local_658);
  local_618.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_618.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_618.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_618.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_618.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_618.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_618.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_618.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_618._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_5e8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_5e8._M_impl.super__Rb_tree_header._M_header;
  local_5e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_5e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_5e8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_5e8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_5e8._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_1f8);
  local_660 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_2d8 = local_338.in0.
              super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_2d0 = local_338.in1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_2c8 = local_338.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_2c0 = local_338.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_348 = local_5b8.out0.
              super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_340 = local_5b8.out1.
              super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  poVar4 = (ostringstream *)(local_4c8 + 8);
  local_4c8._0_8_ = local_660;
  std::__cxx11::ostringstream::ostringstream(poVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"Statement: ",0xb);
  std::ostream::_M_insert<bool>(SUB81(poVar4,0));
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_4c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar4);
  std::ios_base::~ios_base(local_450);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  p_Var5 = (_Rb_tree_node_base *)(local_2b8 + 8);
  local_2b8._8_4_ = _S_red;
  local_2a8._M_allocated_capacity = 0;
  local_290 = 0.0;
  pSVar9 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  local_2a8._8_8_ = p_Var5;
  local_298 = p_Var5;
  (*pSVar9->_vptr_Statement[4])(pSVar9,local_2b8);
  if ((_Rb_tree_node_base *)local_2a8._8_8_ != p_Var5) {
    uVar16 = local_2a8._8_8_;
    do {
      (**(code **)(**(long **)(uVar16 + 0x20) + 0x30))(*(long **)(uVar16 + 0x20),local_1a8);
      uVar16 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar16);
    } while ((_Rb_tree_node_base *)uVar16 != p_Var5);
  }
  if (local_290 != 0.0) {
    poVar4 = (ostringstream *)(local_4c8 + 8);
    local_4c8._0_8_ = local_660;
    std::__cxx11::ostringstream::ostringstream(poVar4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar4,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar4,(char *)local_588._0_8_,local_588._8_8_);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((IVal *)local_588._0_8_ != (IVal *)local_578) {
      operator_delete((void *)local_588._0_8_,local_578._0_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar4);
    std::ios_base::~ios_base(local_450);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_2b8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  pSVar10 = (this->m_executor).
            super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
            .m_data.ptr;
  pIVar18 = (IVal *)&local_348;
  (*pSVar10->_vptr_ShaderExecutor[2])(pSVar10,local_658,&local_2d8,pIVar18,0);
  tcu::Matrix<tcu::Interval,_2,_4>::Matrix((Matrix<tcu::Interval,_2,_4> *)local_4c8);
  tcu::Matrix<tcu::Interval,_2,_4>::Matrix((Matrix<tcu::Interval,_2,_4> *)local_1a8);
  tcu::Matrix<tcu::Interval,_2,_4>::Matrix((Matrix<tcu::Interval,_2,_4> *)local_2b8);
  Environment::bind<tcu::Matrix<float,2,4>>
            ((Environment *)&local_5e8,
             (this->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_4>_>_>.m_ptr,
             (IVal *)local_4c8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_5e8,
             (this->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)local_588);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_5e8,
             (this->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_680);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_5e8,
             (this->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_648);
  Environment::bind<tcu::Matrix<float,2,4>>
            ((Environment *)&local_5e8,
             (this->m_variables).out0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_4>_>_>.m_ptr,
             (IVal *)local_1a8);
  Environment::bind<tcu::Matrix<float,2,4>>
            ((Environment *)&local_5e8,
             (this->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_4>_>_>.m_ptr,
             (IVal *)local_2b8);
  if (local_338.in0.
      super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_finish == pMVar14) {
    local_650 = (IVal *)0x0;
  }
  else {
    local_5f0 = local_658 + (local_658 == 0);
    lVar28 = 0;
    local_650 = (IVal *)0x0;
    pFVar27 = local_620;
    do {
      __return_storage_ptr___00 = (Interval *)local_4c8;
      tcu::Matrix<tcu::Interval,_2,_4>::Matrix((Matrix<tcu::Interval,_2,_4> *)local_1a8);
      tcu::Matrix<tcu::Interval,_2,_4>::Matrix((Matrix<tcu::Interval,_2,_4> *)local_2b8);
      round<tcu::Matrix<float,2,4>>
                ((IVal *)local_588,(shaderexecutor *)pFVar27,
                 (FloatFormat *)
                 (local_338.in0.
                  super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar28),(Matrix<float,_2,_4> *)pIVar18
                );
      ContainerTraits<tcu::Matrix<float,_2,_4>,_tcu::Matrix<tcu::Interval,_2,_4>_>::doConvert
                ((IVal *)__return_storage_ptr___00,pFVar27,(IVal *)local_588);
      pIVar17 = (Interval *)
                Environment::lookup<tcu::Matrix<float,2,4>>
                          ((Environment *)&local_5e8,
                           (this->m_variables).in0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_4>_>_>
                           .m_ptr);
      pIVar21 = __return_storage_ptr___00;
      lVar23 = 0;
      do {
        lVar24 = 0;
        do {
          *(undefined8 *)((long)&pIVar17->m_hi + lVar24) =
               *(undefined8 *)((long)&pIVar21->m_hi + lVar24);
          dVar13 = *(double *)(&pIVar21->m_hasNaN + lVar24 + 8);
          pbVar2 = &((Vector<tcu::Vector<tcu::Interval,_2>,_4> *)&pIVar17->m_hasNaN)->m_data[0].
                    m_data[0].m_hasNaN + lVar24;
          *(undefined8 *)pbVar2 = *(undefined8 *)(&pIVar21->m_hasNaN + lVar24);
          *(double *)(pbVar2 + 8) = dVar13;
          lVar24 = lVar24 + 0x30;
        } while (lVar24 != 0xc0);
        pIVar17 = pIVar17 + 1;
        pIVar21 = pIVar21 + 1;
        bVar29 = lVar23 == 0;
        lVar23 = lVar23 + 1;
      } while (bVar29);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_5e8,
                 (this->m_variables).in1.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_5e8,
                 (this->m_variables).in2.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_5e8,
                 (this->m_variables).in3.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      local_4a0 = (this->m_caseCtx).precision;
      local_4a8 = pFVar27->m_maxValue;
      local_4c8._0_8_ = *(undefined8 *)pFVar27;
      local_4c8._8_4_ = pFVar27->m_fractionBits;
      local_4c8._12_4_ = pFVar27->m_hasSubnormal;
      local_4b8._M_allocated_capacity._0_4_ = pFVar27->m_hasInf;
      local_4b8._M_allocated_capacity._4_4_ = pFVar27->m_hasNaN;
      local_4b8._8_1_ = pFVar27->m_exactPrecision;
      local_4b8._9_3_ = *(undefined3 *)&pFVar27->field_0x19;
      local_4b8._12_4_ = *(undefined4 *)&pFVar27->field_0x1c;
      local_490 = 0;
      pSVar9 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
      local_498 = &local_5e8;
      (*pSVar9->_vptr_Statement[3])(pSVar9,__return_storage_ptr___00);
      pIVar18 = Environment::lookup<tcu::Matrix<float,2,4>>
                          ((Environment *)&local_5e8,
                           (this->m_variables).out1.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_4>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Matrix<float,_2,_4>,_tcu::Matrix<tcu::Interval,_2,_4>_>::doConvert
                ((IVal *)__return_storage_ptr___00,&local_618,pIVar18);
      puVar22 = local_2b8;
      lVar23 = 0;
      do {
        lVar24 = 0;
        do {
          *(undefined8 *)(puVar22 + lVar24 + 0x10) =
               *(undefined8 *)((long)&__return_storage_ptr___00->m_hi + lVar24);
          pbVar2 = &((Vector<tcu::Vector<tcu::Interval,_2>,_4> *)
                    &__return_storage_ptr___00->m_hasNaN)->m_data[0].m_data[0].m_hasNaN + lVar24;
          dVar13 = *(double *)(pbVar2 + 8);
          *(undefined8 *)(puVar22 + lVar24) = *(undefined8 *)pbVar2;
          *(double *)((long)(puVar22 + lVar24) + 8) = dVar13;
          lVar24 = lVar24 + 0x30;
        } while (lVar24 != 0xc0);
        puVar22 = puVar22 + 0x18;
        __return_storage_ptr___00 = __return_storage_ptr___00 + 1;
        bVar29 = lVar23 == 0;
        lVar23 = lVar23 + 1;
      } while (bVar29);
      bVar29 = contains<tcu::Matrix<float,2,4>>
                         ((IVal *)local_2b8,
                          local_5b8.out1.
                          super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar28);
      local_4c8._0_8_ = local_4c8 + 0x10;
      msg = (string *)local_4c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)msg,"Shader output 1 is outside acceptable range","");
      bVar29 = tcu::ResultCollector::check(&local_1f8,bVar29,msg);
      if ((TestLog *)local_4c8._0_8_ != (TestLog *)(local_4c8 + 0x10)) {
        operator_delete((void *)local_4c8._0_8_,
                        CONCAT44(local_4b8._M_allocated_capacity._4_4_,
                                 local_4b8._M_allocated_capacity._0_4_) + 1);
      }
      pIVar18 = Environment::lookup<tcu::Matrix<float,2,4>>
                          ((Environment *)&local_5e8,
                           (this->m_variables).out0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_4>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Matrix<float,_2,_4>,_tcu::Matrix<tcu::Interval,_2,_4>_>::doConvert
                ((IVal *)msg,&local_618,pIVar18);
      puVar22 = local_1a8;
      lVar23 = 0;
      do {
        lVar24 = 0;
        do {
          *(undefined8 *)(puVar22 + lVar24 + 0x10) = *(undefined8 *)((long)&msg->field_2 + lVar24);
          puVar19 = (undefined8 *)((long)&(msg->_M_dataplus)._M_p + lVar24);
          uVar16 = puVar19[1];
          *(undefined8 *)(puVar22 + lVar24) = *puVar19;
          *(undefined8 *)((long)(puVar22 + lVar24) + 8) = uVar16;
          lVar24 = lVar24 + 0x30;
        } while (lVar24 != 0xc0);
        puVar22 = puVar22 + 0x18;
        msg = (string *)((msg->field_2)._M_local_buf + 8);
        bVar30 = lVar23 == 0;
        lVar23 = lVar23 + 1;
      } while (bVar30);
      bVar30 = contains<tcu::Matrix<float,2,4>>
                         ((IVal *)local_1a8,
                          local_5b8.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar28);
      local_4c8._0_8_ = local_4c8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_4c8,"Shader output 0 is outside acceptable range","");
      bVar30 = tcu::ResultCollector::check(&local_1f8,bVar30,(string *)local_4c8);
      if ((TestLog *)local_4c8._0_8_ != (TestLog *)(local_4c8 + 0x10)) {
        operator_delete((void *)local_4c8._0_8_,
                        CONCAT44(local_4b8._M_allocated_capacity._4_4_,
                                 local_4b8._M_allocated_capacity._0_4_) + 1);
      }
      pFVar27 = local_620;
      uVar20 = (int)local_650 + ((byte)~(bVar29 && bVar30) & 1);
      pIVar18 = (IVal *)(ulong)uVar20;
      local_650 = pIVar18;
      if ((int)uVar20 < 0x65 && (!bVar29 || !bVar30)) {
        local_4c8._0_8_ = local_660;
        poVar4 = (ostringstream *)(local_4c8 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar4);
        pcVar25 = "Failed";
        if (bVar29 && bVar30) {
          pcVar25 = "Passed";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,pcVar25,6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\t",1);
        pVVar11 = (this->m_variables).in0.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_4>_>_>.
                  m_ptr;
        val = (Matrix<float,_2,_4> *)local_578;
        pcVar12 = (pVVar11->m_name)._M_dataplus._M_p;
        local_588._0_8_ = val;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_588,pcVar12,pcVar12 + (pVVar11->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar4,(char *)local_588._0_8_,local_588._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," = ",3);
        valueToString<tcu::Matrix<float,2,4>>
                  (&local_680,(shaderexecutor *)&local_618,
                   (FloatFormat *)
                   (local_338.in0.
                    super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar28),val);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar4,local_680._M_dataplus._M_p,local_680._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_680._M_dataplus._M_p != &local_680.field_2) {
          operator_delete(local_680._M_dataplus._M_p,local_680.field_2._M_allocated_capacity + 1);
        }
        if ((Matrix<float,_2,_4> *)local_588._0_8_ != (Matrix<float,_2,_4> *)local_578) {
          operator_delete((void *)local_588._0_8_,local_578._0_8_ + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\t",1);
        pVVar11 = (this->m_variables).out0.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_4>_>_>.
                  m_ptr;
        pIVar18 = (IVal *)local_578;
        pcVar12 = (pVVar11->m_name)._M_dataplus._M_p;
        local_588._0_8_ = pIVar18;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_588,pcVar12,pcVar12 + (pVVar11->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar4,(char *)local_588._0_8_,local_588._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," = ",3);
        valueToString<tcu::Matrix<float,2,4>>
                  (&local_680,(shaderexecutor *)&local_618,
                   (FloatFormat *)
                   (local_5b8.out0.
                    super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar28),
                   (Matrix<float,_2,_4> *)pIVar18);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar4,local_680._M_dataplus._M_p,local_680._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar4,"\tExpected range: ",0x11);
        intervalToString<tcu::Matrix<float,2,4>>
                  (&local_648,(shaderexecutor *)&local_618,(FloatFormat *)local_1a8,pIVar18);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar4,local_648._M_dataplus._M_p,local_648._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_648._M_dataplus._M_p != &local_648.field_2) {
          operator_delete(local_648._M_dataplus._M_p,local_648.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_680._M_dataplus._M_p != &local_680.field_2) {
          operator_delete(local_680._M_dataplus._M_p,local_680.field_2._M_allocated_capacity + 1);
        }
        if ((IVal *)local_588._0_8_ != (IVal *)local_578) {
          operator_delete((void *)local_588._0_8_,local_578._0_8_ + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\t",1);
        pVVar11 = (this->m_variables).out1.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_4>_>_>.
                  m_ptr;
        pIVar18 = (IVal *)local_578;
        pcVar12 = (pVVar11->m_name)._M_dataplus._M_p;
        local_588._0_8_ = pIVar18;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_588,pcVar12,pcVar12 + (pVVar11->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar4,(char *)local_588._0_8_,local_588._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," = ",3);
        valueToString<tcu::Matrix<float,2,4>>
                  (&local_680,(shaderexecutor *)&local_618,
                   (FloatFormat *)
                   (local_5b8.out1.
                    super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar28),
                   (Matrix<float,_2,_4> *)pIVar18);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar4,local_680._M_dataplus._M_p,local_680._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar4,"\tExpected range: ",0x11);
        intervalToString<tcu::Matrix<float,2,4>>
                  (&local_648,(shaderexecutor *)&local_618,(FloatFormat *)local_2b8,pIVar18);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar4,local_648._M_dataplus._M_p,local_648._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_648._M_dataplus._M_p != &local_648.field_2) {
          operator_delete(local_648._M_dataplus._M_p,local_648.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_680._M_dataplus._M_p != &local_680.field_2) {
          operator_delete(local_680._M_dataplus._M_p,local_680.field_2._M_allocated_capacity + 1);
        }
        if ((IVal *)local_588._0_8_ != (IVal *)local_578) {
          operator_delete((void *)local_588._0_8_,local_578._0_8_ + 1);
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_4c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar4);
        std::ios_base::~ios_base(local_450);
      }
      lVar28 = lVar28 + 1;
    } while (lVar28 != local_5f0);
  }
  iVar15 = (int)local_650;
  if (100 < iVar15) {
    poVar4 = (ostringstream *)(local_4c8 + 8);
    local_4c8._0_8_ = local_660;
    std::__cxx11::ostringstream::ostringstream(poVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"(Skipped ",9);
    std::ostream::operator<<(poVar4,iVar15 + -100);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," messages.)",0xb);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar4);
    std::ios_base::~ios_base(local_450);
  }
  poVar4 = (ostringstream *)(local_4c8 + 8);
  if (iVar15 == 0) {
    local_4c8._0_8_ = local_660;
    std::__cxx11::ostringstream::ostringstream(poVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_4c8._0_8_ = local_660;
    std::__cxx11::ostringstream::ostringstream(poVar4);
    std::ostream::operator<<(poVar4,iVar15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream(poVar4);
  std::ios_base::~ios_base(local_450);
  if (iVar15 == 0) {
    local_4c8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_4c8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4c8,"Pass","");
    local_628->m_code = QP_TEST_RESULT_PASS;
    (local_628->m_description)._M_dataplus._M_p = (pointer)&(local_628->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_628->m_description,local_4c8._0_8_,
               (char *)(local_4c8._0_8_ + CONCAT44(local_4c8._12_4_,local_4c8._8_4_)));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_4c8 + 0x10)) goto LAB_0092db2f;
    uVar16 = (_Base_ptr)
             CONCAT44(local_4b8._M_allocated_capacity._4_4_,local_4b8._M_allocated_capacity._0_4_);
    local_2b8._0_8_ = local_4c8._0_8_;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
    std::ostream::operator<<(local_4c8,iVar15);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c8);
    std::ios_base::~ios_base(local_458);
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_4c8 + 0x10);
    local_4c8._0_8_ = paVar6;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_4c8," test failed. Check log for the details","");
    p_Var3 = (_Base_ptr)
             (CONCAT44(local_4c8._12_4_,local_4c8._8_4_) + CONCAT44(YStack_2ac,local_2b8._8_4_));
    uVar16 = (_Base_ptr)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._0_8_ != &local_2a8) {
      uVar16 = local_2a8._M_allocated_capacity;
    }
    if ((ulong)uVar16 < p_Var3) {
      p_Var26 = (_Base_ptr)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c8._0_8_ != paVar6) {
        p_Var26 = (_Base_ptr)
                  CONCAT44(local_4b8._M_allocated_capacity._4_4_,
                           local_4b8._M_allocated_capacity._0_4_);
      }
      if (p_Var26 < p_Var3) goto LAB_0092d9b3;
      puVar19 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_4c8,0,(char *)0x0,local_2b8._0_8_);
    }
    else {
LAB_0092d9b3:
      puVar19 = (undefined8 *)std::__cxx11::string::_M_append(local_2b8,local_4c8._0_8_);
    }
    local_1a8._0_8_ = local_1a8 + 0x10;
    pdVar1 = (double *)(puVar19 + 2);
    if ((double *)*puVar19 == pdVar1) {
      local_1a8._16_8_ = *pdVar1;
      local_1a8._24_4_ = *(undefined4 *)(puVar19 + 3);
      local_1a8._28_4_ = *(undefined4 *)((long)puVar19 + 0x1c);
    }
    else {
      local_1a8._16_8_ = *pdVar1;
      local_1a8._0_8_ = (double *)*puVar19;
    }
    local_1a8._8_8_ = puVar19[1];
    *puVar19 = pdVar1;
    puVar19[1] = 0;
    *(undefined1 *)pdVar1 = 0;
    local_628->m_code = QP_TEST_RESULT_FAIL;
    (local_628->m_description)._M_dataplus._M_p = (pointer)&(local_628->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_628->m_description,local_1a8._0_8_,
               (undefined1 *)(local_1a8._8_8_ + local_1a8._0_8_));
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._0_8_ != paVar6) {
      operator_delete((void *)local_4c8._0_8_,
                      CONCAT44(local_4b8._M_allocated_capacity._4_4_,
                               local_4b8._M_allocated_capacity._0_4_) + 1);
    }
    uVar16 = local_2a8._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._0_8_ == &local_2a8) goto LAB_0092db2f;
  }
  operator_delete((void *)local_2b8._0_8_,(ulong)((long)&((_Base_ptr)uVar16)->_M_color + 1));
LAB_0092db2f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_message._M_dataplus._M_p != &local_1f8.m_message.field_2) {
    operator_delete(local_1f8.m_message._M_dataplus._M_p,
                    local_1f8.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_prefix._M_dataplus._M_p != &local_1f8.m_prefix.field_2) {
    operator_delete(local_1f8.m_prefix._M_dataplus._M_p,
                    local_1f8.m_prefix.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_5e8);
  if (local_5b8.out1.
      super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5b8.out1.
                    super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_5b8.out1.
                          super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_5b8.out1.
                          super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_5b8.out0.
      super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5b8.out0.
                    super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_5b8.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_5b8.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_338.in3.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_338.in3.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_338.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_338.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_338.in2.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_338.in2.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_338.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_338.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_338.in1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_338.in1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_338.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_338.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_338.in0.
      super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_338.in0.
                    super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_338.in0.
                          super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_338.in0.
                          super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return local_628;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}